

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void Transform(uint32_t *s,uint32_t *chunk,size_t blocks)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t auVar5 [4];
  uint32_t auVar6 [4];
  uint32_t auVar7 [4];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined1 (*pauVar15) [16];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint32_t uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  uint32_t uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint32_t uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint32_t *puVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint64_t inp;
  uint64_t inp_end;
  uint32_t xfer [4];
  
  auVar7 = TransformSSE4::SHUF_DC00;
  auVar6 = TransformSSE4::SHUF_00BA;
  auVar5 = TransformSSE4::FLIP_MASK;
  if (use_optimized_transform == '\x01') {
    if ((blocks & 0x3ffffffffffffff) != 0) {
      pauVar15 = (undefined1 (*) [16])(chunk + blocks * 0x10);
      uVar8 = *s;
      uVar11 = s[1];
      uVar19 = s[2];
      uVar57 = s[3];
      uVar13 = s[4];
      uVar28 = s[5];
      uVar33 = s[6];
      uVar40 = s[7];
      do {
        puVar68 = TransformSSE4::K256;
        auVar97 = pshufb(*(undefined1 (*) [16])chunk,(undefined1  [16])auVar5);
        auVar99 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x10),(undefined1  [16])auVar5);
        auVar101 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x20),(undefined1  [16])auVar5);
        auVar103 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x30),(undefined1  [16])auVar5);
        lVar27 = 3;
        do {
          uVar73 = auVar97._4_4_;
          uVar29 = auVar97._8_4_;
          uVar42 = auVar97._12_4_;
          uVar47 = (uVar13 >> 0xe | uVar13 << 0x12) ^ uVar13;
          uVar50 = (uVar8 >> 9 | uVar8 << 0x17) ^ uVar8;
          uVar74 = auVar101._4_4_;
          uVar53 = auVar101._8_4_;
          uVar9 = auVar101._12_4_;
          uVar12 = auVar103._0_4_;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar13;
          uVar50 = (uVar50 >> 0xb | uVar50 << 0x15) ^ uVar8;
          iVar39 = uVar40 + ((uVar28 ^ uVar33) & uVar13 ^ uVar33) + (uVar47 >> 6 | uVar47 << 0x1a) +
                            *puVar68 + auVar97._0_4_;
          uVar25 = auVar99._0_4_;
          uVar56 = uVar57 + iVar39;
          uVar50 = iVar39 + (uVar50 >> 2 | uVar50 << 0x1e) +
                   ((uVar8 | uVar19) & uVar11 | uVar8 & uVar19);
          uVar47 = (uVar56 >> 0xe | uVar56 * 0x40000) ^ uVar56;
          uVar51 = (uVar50 >> 9 | uVar50 * 0x800000) ^ uVar50;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar56;
          uVar51 = (uVar51 >> 0xb | uVar51 << 0x15) ^ uVar50;
          iVar39 = uVar33 + ((uVar13 ^ uVar28) & uVar56 ^ uVar28) + (uVar47 >> 6 | uVar47 << 0x1a) +
                            puVar68[1] + uVar73;
          uVar19 = uVar19 + iVar39;
          uVar54 = auVar103._4_4_;
          uVar26 = auVar103._8_4_;
          uVar32 = auVar103._12_4_;
          auVar106._0_8_ = CONCAT44(uVar26,uVar26);
          auVar106._8_4_ = uVar32;
          auVar106._12_4_ = uVar32;
          uVar47 = iVar39 + (uVar51 >> 2 | uVar51 << 0x1e) +
                   ((uVar50 | uVar11) & uVar8 | uVar50 & uVar11);
          uVar51 = (uVar19 >> 0xe | uVar19 * 0x40000) ^ uVar19;
          uVar52 = (uVar47 >> 9 | uVar47 * 0x800000) ^ uVar47;
          auVar110._0_8_ = auVar106._0_8_ >> 0x11;
          auVar110._8_8_ = auVar106._8_8_ >> 0x11;
          auVar89._0_8_ = auVar106._0_8_ >> 0x13;
          auVar89._8_8_ = auVar106._8_8_ >> 0x13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar19;
          auVar105._0_4_ = uVar26 >> 10;
          auVar105._4_4_ = uVar26 >> 10;
          auVar105._8_4_ = uVar32 >> 10;
          auVar105._12_4_ = uVar32 >> 10;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar47;
          iVar39 = uVar28 + ((uVar56 ^ uVar13) & uVar19 ^ uVar13) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[2] + uVar29;
          auVar106 = pshufb(auVar105 ^ auVar110 ^ auVar89,(undefined1  [16])auVar6);
          uVar11 = uVar11 + iVar39;
          uVar72 = uVar74 + auVar97._0_4_ +
                   ((uVar73 << 0x19 | uVar73 >> 7) ^ uVar73 << 0xe ^ uVar73 >> 0x12 ^ uVar73 >> 3) +
                   auVar106._0_4_;
          uVar73 = uVar53 + uVar73 +
                   ((uVar29 << 0x19 | uVar29 >> 7) ^ uVar29 << 0xe ^ uVar29 >> 0x12 ^ uVar29 >> 3) +
                   auVar106._4_4_;
          auVar75._0_8_ = CONCAT44(uVar72,uVar72);
          auVar75._8_4_ = uVar73;
          auVar75._12_4_ = uVar73;
          uVar28 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar47 | uVar8) & uVar50 | uVar47 & uVar8);
          uVar51 = (uVar11 >> 0xe | uVar11 * 0x40000) ^ uVar11;
          auVar76._0_8_ = auVar75._0_8_ >> 0x11;
          auVar76._8_8_ = auVar75._8_8_ >> 0x11;
          uVar52 = (uVar28 >> 9 | uVar28 * 0x800000) ^ uVar28;
          auVar90._0_8_ = auVar75._0_8_ >> 0x13;
          auVar90._8_8_ = auVar75._8_8_ >> 0x13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar11;
          auVar98._0_4_ = uVar72 >> 10;
          auVar98._4_4_ = uVar72 >> 10;
          auVar98._8_4_ = uVar73 >> 10;
          auVar98._12_4_ = uVar73 >> 10;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar28;
          iVar39 = uVar13 + ((uVar19 ^ uVar56) & uVar11 ^ uVar56) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[3] + uVar42;
          auVar103 = pshufb(auVar98 ^ auVar76 ^ auVar90,(undefined1  [16])auVar7);
          uVar8 = uVar8 + iVar39;
          auVar97._0_4_ = auVar103._0_4_ + uVar72;
          auVar97._4_4_ = auVar103._4_4_ + uVar73;
          auVar97._8_4_ =
               auVar103._8_4_ +
               uVar9 + uVar29 +
               ((uVar42 << 0x19 | uVar42 >> 7) ^ uVar42 << 0xe ^ uVar42 >> 0x12 ^ uVar42 >> 3) +
               auVar106._8_4_;
          auVar97._12_4_ =
               auVar103._12_4_ +
               uVar12 + uVar42 +
               ((uVar25 << 0x19 | uVar25 >> 7) ^ uVar25 << 0xe ^ uVar25 >> 0x12 ^ uVar25 >> 3) +
               auVar106._12_4_;
          uVar13 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar28 | uVar50) & uVar47 | uVar28 & uVar50);
          uVar73 = auVar99._4_4_;
          uVar42 = auVar99._8_4_;
          uVar49 = auVar99._12_4_;
          uVar51 = (uVar8 >> 0xe | uVar8 * 0x40000) ^ uVar8;
          uVar52 = (uVar13 >> 9 | uVar13 * 0x800000) ^ uVar13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar8;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar13;
          iVar39 = uVar56 + ((uVar11 ^ uVar19) & uVar8 ^ uVar19) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[4] + uVar25;
          uVar29 = auVar101._0_4_;
          uVar50 = uVar50 + iVar39;
          uVar56 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar13 | uVar47) & uVar28 | uVar13 & uVar47);
          uVar51 = (uVar50 >> 0xe | uVar50 * 0x40000) ^ uVar50;
          uVar52 = (uVar56 >> 9 | uVar56 * 0x800000) ^ uVar56;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar50;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar56;
          iVar39 = uVar19 + ((uVar8 ^ uVar11) & uVar50 ^ uVar11) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[5] + uVar73;
          uVar47 = uVar47 + iVar39;
          auVar77._0_8_ = CONCAT44(auVar97._8_4_,auVar97._8_4_);
          auVar77._8_4_ = auVar97._12_4_;
          auVar77._12_4_ = auVar97._12_4_;
          uVar19 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar56 | uVar28) & uVar13 | uVar56 & uVar28);
          uVar51 = (uVar47 >> 0xe | uVar47 * 0x40000) ^ uVar47;
          uVar52 = (uVar19 >> 9 | uVar19 * 0x800000) ^ uVar19;
          auVar78._0_8_ = auVar77._0_8_ >> 0x11;
          auVar78._8_8_ = auVar77._8_8_ >> 0x11;
          auVar91._0_8_ = auVar77._0_8_ >> 0x13;
          auVar91._8_8_ = auVar77._8_8_ >> 0x13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar47;
          auVar107._0_4_ = auVar97._8_4_ >> 10;
          auVar107._4_4_ = auVar97._8_4_ >> 10;
          auVar107._8_4_ = auVar97._12_4_ >> 10;
          auVar107._12_4_ = auVar97._12_4_ >> 10;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar19;
          iVar39 = uVar11 + ((uVar50 ^ uVar8) & uVar47 ^ uVar8) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[6] + uVar42;
          auVar103 = pshufb(auVar107 ^ auVar78 ^ auVar91,(undefined1  [16])auVar6);
          uVar28 = uVar28 + iVar39;
          uVar72 = uVar54 + uVar25 +
                   ((uVar73 << 0x19 | uVar73 >> 7) ^ uVar73 << 0xe ^ uVar73 >> 0x12 ^ uVar73 >> 3) +
                   auVar103._0_4_;
          uVar73 = uVar26 + uVar73 +
                   ((uVar42 << 0x19 | uVar42 >> 7) ^ uVar42 << 0xe ^ uVar42 >> 0x12 ^ uVar42 >> 3) +
                   auVar103._4_4_;
          auVar79._0_8_ = CONCAT44(uVar72,uVar72);
          auVar79._8_4_ = uVar73;
          auVar79._12_4_ = uVar73;
          uVar11 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar19 | uVar13) & uVar56 | uVar19 & uVar13);
          uVar51 = (uVar28 >> 0xe | uVar28 * 0x40000) ^ uVar28;
          auVar80._0_8_ = auVar79._0_8_ >> 0x11;
          auVar80._8_8_ = auVar79._8_8_ >> 0x11;
          uVar52 = (uVar11 >> 9 | uVar11 * 0x800000) ^ uVar11;
          auVar92._0_8_ = auVar79._0_8_ >> 0x13;
          auVar92._8_8_ = auVar79._8_8_ >> 0x13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar28;
          auVar100._0_4_ = uVar72 >> 10;
          auVar100._4_4_ = uVar72 >> 10;
          auVar100._8_4_ = uVar73 >> 10;
          auVar100._12_4_ = uVar73 >> 10;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar11;
          iVar39 = uVar8 + ((uVar47 ^ uVar50) & uVar28 ^ uVar50) + (uVar51 >> 6 | uVar51 << 0x1a) +
                           puVar68[7] + uVar49;
          auVar101 = pshufb(auVar100 ^ auVar80 ^ auVar92,(undefined1  [16])auVar7);
          uVar13 = uVar13 + iVar39;
          auVar99._0_4_ = auVar101._0_4_ + uVar72;
          auVar99._4_4_ = auVar101._4_4_ + uVar73;
          auVar99._8_4_ =
               auVar101._8_4_ +
               uVar32 + uVar42 +
               ((uVar49 << 0x19 | uVar49 >> 7) ^ uVar49 << 0xe ^ uVar49 >> 0x12 ^ uVar49 >> 3) +
               auVar103._8_4_;
          auVar99._12_4_ =
               auVar101._12_4_ +
               auVar97._0_4_ + uVar49 +
               ((uVar29 << 0x19 | uVar29 >> 7) ^ uVar29 << 0xe ^ uVar29 >> 0x12 ^ uVar29 >> 3) +
               auVar103._12_4_;
          uVar8 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                  ((uVar11 | uVar56) & uVar19 | uVar11 & uVar56);
          uVar51 = (uVar13 >> 0xe | uVar13 * 0x40000) ^ uVar13;
          uVar52 = (uVar8 >> 9 | uVar8 * 0x800000) ^ uVar8;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar13;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar8;
          iVar39 = uVar50 + ((uVar28 ^ uVar47) & uVar13 ^ uVar47) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[8] + uVar29;
          uVar56 = uVar56 + iVar39;
          uVar50 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar8 | uVar19) & uVar11 | uVar8 & uVar19);
          uVar51 = (uVar56 >> 0xe | uVar56 * 0x40000) ^ uVar56;
          uVar52 = (uVar50 >> 9 | uVar50 * 0x800000) ^ uVar50;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar56;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar50;
          iVar39 = uVar47 + ((uVar13 ^ uVar28) & uVar56 ^ uVar28) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[9] + uVar74;
          uVar19 = uVar19 + iVar39;
          auVar81._0_8_ = CONCAT44(auVar99._8_4_,auVar99._8_4_);
          auVar81._8_4_ = auVar99._12_4_;
          auVar81._12_4_ = auVar99._12_4_;
          uVar47 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar50 | uVar11) & uVar8 | uVar50 & uVar11);
          uVar51 = (uVar19 >> 0xe | uVar19 * 0x40000) ^ uVar19;
          uVar52 = (uVar47 >> 9 | uVar47 * 0x800000) ^ uVar47;
          auVar82._0_8_ = auVar81._0_8_ >> 0x11;
          auVar82._8_8_ = auVar81._8_8_ >> 0x11;
          auVar93._0_8_ = auVar81._0_8_ >> 0x13;
          auVar93._8_8_ = auVar81._8_8_ >> 0x13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar19;
          auVar108._0_4_ = auVar99._8_4_ >> 10;
          auVar108._4_4_ = auVar99._8_4_ >> 10;
          auVar108._8_4_ = auVar99._12_4_ >> 10;
          auVar108._12_4_ = auVar99._12_4_ >> 10;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar47;
          iVar39 = uVar28 + ((uVar56 ^ uVar13) & uVar19 ^ uVar13) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[10] + uVar53;
          auVar106 = pshufb(auVar108 ^ auVar82 ^ auVar93,(undefined1  [16])auVar6);
          uVar11 = uVar11 + iVar39;
          uVar72 = auVar97._4_4_ + uVar29 +
                   ((uVar74 << 0x19 | uVar74 >> 7) ^ uVar74 << 0xe ^ uVar74 >> 0x12 ^ uVar74 >> 3) +
                   auVar106._0_4_;
          uVar74 = auVar97._8_4_ + uVar74 +
                   ((uVar53 << 0x19 | uVar53 >> 7) ^ uVar53 << 0xe ^ uVar53 >> 0x12 ^ uVar53 >> 3) +
                   auVar106._4_4_;
          auVar83._0_8_ = CONCAT44(uVar72,uVar72);
          auVar83._8_4_ = uVar74;
          auVar83._12_4_ = uVar74;
          uVar28 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar47 | uVar8) & uVar50 | uVar47 & uVar8);
          uVar51 = (uVar11 >> 0xe | uVar11 * 0x40000) ^ uVar11;
          auVar84._0_8_ = auVar83._0_8_ >> 0x11;
          auVar84._8_8_ = auVar83._8_8_ >> 0x11;
          uVar52 = (uVar28 >> 9 | uVar28 * 0x800000) ^ uVar28;
          auVar94._0_8_ = auVar83._0_8_ >> 0x13;
          auVar94._8_8_ = auVar83._8_8_ >> 0x13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar11;
          auVar102._0_4_ = uVar72 >> 10;
          auVar102._4_4_ = uVar72 >> 10;
          auVar102._8_4_ = uVar74 >> 10;
          auVar102._12_4_ = uVar74 >> 10;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar28;
          iVar39 = uVar13 + ((uVar19 ^ uVar56) & uVar11 ^ uVar56) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            puVar68[0xb] + uVar9;
          auVar103 = pshufb(auVar102 ^ auVar84 ^ auVar94,(undefined1  [16])auVar7);
          uVar8 = uVar8 + iVar39;
          auVar101._0_4_ = auVar103._0_4_ + uVar72;
          auVar101._4_4_ = auVar103._4_4_ + uVar74;
          auVar101._8_4_ =
               auVar103._8_4_ +
               auVar97._12_4_ + uVar53 +
               ((uVar9 << 0x19 | uVar9 >> 7) ^ uVar9 << 0xe ^ uVar9 >> 0x12 ^ uVar9 >> 3) +
               auVar106._8_4_;
          auVar101._12_4_ =
               auVar103._12_4_ +
               auVar99._0_4_ + uVar9 +
               ((uVar12 << 0x19 | uVar12 >> 7) ^ uVar12 << 0xe ^ uVar12 >> 0x12 ^ uVar12 >> 3) +
               auVar106._12_4_;
          uVar13 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar28 | uVar50) & uVar47 | uVar28 & uVar50);
          puVar1 = puVar68 + 0xc;
          puVar2 = puVar68 + 0xd;
          puVar3 = puVar68 + 0xe;
          puVar4 = puVar68 + 0xf;
          puVar68 = puVar68 + 0x10;
          uVar51 = (uVar8 >> 0xe | uVar8 * 0x40000) ^ uVar8;
          uVar52 = (uVar13 >> 9 | uVar13 * 0x800000) ^ uVar13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar8;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar13;
          iVar39 = uVar56 + ((uVar11 ^ uVar19) & uVar8 ^ uVar19) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            *puVar1 + uVar12;
          uVar40 = uVar50 + iVar39;
          uVar57 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar13 | uVar47) & uVar28 | uVar13 & uVar47);
          uVar50 = (uVar40 >> 0xe | uVar40 * 0x40000) ^ uVar40;
          uVar51 = (uVar57 >> 9 | uVar57 * 0x800000) ^ uVar57;
          uVar50 = (uVar50 >> 5 | uVar50 << 0x1b) ^ uVar40;
          uVar51 = (uVar51 >> 0xb | uVar51 << 0x15) ^ uVar57;
          iVar39 = uVar19 + ((uVar8 ^ uVar11) & uVar40 ^ uVar11) + (uVar50 >> 6 | uVar50 << 0x1a) +
                            *puVar2 + uVar54;
          uVar33 = uVar47 + iVar39;
          auVar85._0_8_ = CONCAT44(auVar101._8_4_,auVar101._8_4_);
          auVar85._8_4_ = auVar101._12_4_;
          auVar85._12_4_ = auVar101._12_4_;
          uVar19 = iVar39 + (uVar51 >> 2 | uVar51 << 0x1e) +
                   ((uVar57 | uVar28) & uVar13 | uVar57 & uVar28);
          uVar47 = (uVar33 >> 0xe | uVar33 * 0x40000) ^ uVar33;
          uVar50 = (uVar19 >> 9 | uVar19 * 0x800000) ^ uVar19;
          auVar86._0_8_ = auVar85._0_8_ >> 0x11;
          auVar86._8_8_ = auVar85._8_8_ >> 0x11;
          auVar95._0_8_ = auVar85._0_8_ >> 0x13;
          auVar95._8_8_ = auVar85._8_8_ >> 0x13;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar33;
          auVar109._0_4_ = auVar101._8_4_ >> 10;
          auVar109._4_4_ = auVar101._8_4_ >> 10;
          auVar109._8_4_ = auVar101._12_4_ >> 10;
          auVar109._12_4_ = auVar101._12_4_ >> 10;
          uVar50 = (uVar50 >> 0xb | uVar50 << 0x15) ^ uVar19;
          iVar39 = uVar11 + ((uVar40 ^ uVar8) & uVar33 ^ uVar8) + (uVar47 >> 6 | uVar47 << 0x1a) +
                            *puVar3 + uVar26;
          auVar110 = pshufb(auVar109 ^ auVar86 ^ auVar95,(undefined1  [16])auVar6);
          uVar28 = uVar28 + iVar39;
          uVar51 = auVar99._4_4_ + uVar12 +
                   ((uVar54 << 0x19 | uVar54 >> 7) ^ uVar54 << 0xe ^ uVar54 >> 0x12 ^ uVar54 >> 3) +
                   auVar110._0_4_;
          uVar52 = auVar99._8_4_ + uVar54 +
                   ((uVar26 << 0x19 | uVar26 >> 7) ^ uVar26 << 0xe ^ uVar26 >> 0x12 ^ uVar26 >> 3) +
                   auVar110._4_4_;
          auVar87._0_8_ = CONCAT44(uVar51,uVar51);
          auVar87._8_4_ = uVar52;
          auVar87._12_4_ = uVar52;
          uVar11 = iVar39 + (uVar50 >> 2 | uVar50 << 0x1e) +
                   ((uVar19 | uVar13) & uVar57 | uVar19 & uVar13);
          uVar47 = (uVar28 >> 0xe | uVar28 * 0x40000) ^ uVar28;
          auVar88._0_8_ = auVar87._0_8_ >> 0x11;
          auVar88._8_8_ = auVar87._8_8_ >> 0x11;
          uVar50 = (uVar11 >> 9 | uVar11 * 0x800000) ^ uVar11;
          auVar96._0_8_ = auVar87._0_8_ >> 0x13;
          auVar96._8_8_ = auVar87._8_8_ >> 0x13;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar28;
          auVar104._0_4_ = uVar51 >> 10;
          auVar104._4_4_ = uVar51 >> 10;
          auVar104._8_4_ = uVar52 >> 10;
          auVar104._12_4_ = uVar52 >> 10;
          uVar50 = (uVar50 >> 0xb | uVar50 << 0x15) ^ uVar11;
          iVar39 = uVar8 + ((uVar33 ^ uVar40) & uVar28 ^ uVar40) + (uVar47 >> 6 | uVar47 << 0x1a) +
                           *puVar4 + uVar32;
          auVar106 = pshufb(auVar104 ^ auVar88 ^ auVar96,(undefined1  [16])auVar7);
          uVar13 = uVar13 + iVar39;
          auVar103._0_4_ = auVar106._0_4_ + uVar51;
          auVar103._4_4_ = auVar106._4_4_ + uVar52;
          auVar103._8_4_ =
               auVar106._8_4_ +
               auVar99._12_4_ + uVar26 +
               ((uVar32 << 0x19 | uVar32 >> 7) ^ uVar32 << 0xe ^ uVar32 >> 0x12 ^ uVar32 >> 3) +
               auVar110._8_4_;
          auVar103._12_4_ =
               auVar106._12_4_ +
               auVar101._0_4_ + uVar32 +
               ((auVar97._0_4_ * 0x2000000 | auVar97._0_4_ >> 7) ^ auVar97._0_4_ * 0x4000 ^
                auVar97._0_4_ >> 0x12 ^ auVar97._0_4_ >> 3) + auVar110._12_4_;
          uVar8 = iVar39 + (uVar50 >> 2 | uVar50 << 0x1e) +
                  ((uVar11 | uVar57) & uVar19 | uVar11 & uVar57);
          lVar27 = lVar27 + -1;
        } while (lVar27 != 0);
        lVar27 = 2;
        do {
          uVar47 = (uVar13 >> 0xe | uVar13 << 0x12) ^ uVar13;
          uVar50 = (uVar8 >> 9 | uVar8 << 0x17) ^ uVar8;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar13;
          uVar50 = (uVar50 >> 0xb | uVar50 << 0x15) ^ uVar8;
          iVar39 = uVar40 + ((uVar28 ^ uVar33) & uVar13 ^ uVar33) + (uVar47 >> 6 | uVar47 << 0x1a) +
                            auVar97._0_4_ + *puVar68;
          uVar56 = uVar57 + iVar39;
          uVar50 = iVar39 + (uVar50 >> 2 | uVar50 << 0x1e) +
                   ((uVar8 | uVar19) & uVar11 | uVar8 & uVar19);
          uVar47 = (uVar56 >> 0xe | uVar56 * 0x40000) ^ uVar56;
          uVar51 = (uVar50 >> 9 | uVar50 * 0x800000) ^ uVar50;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar56;
          uVar51 = (uVar51 >> 0xb | uVar51 << 0x15) ^ uVar50;
          iVar39 = uVar33 + ((uVar13 ^ uVar28) & uVar56 ^ uVar28) + (uVar47 >> 6 | uVar47 << 0x1a) +
                            auVar97._4_4_ + puVar68[1];
          uVar19 = uVar19 + iVar39;
          uVar47 = iVar39 + (uVar51 >> 2 | uVar51 << 0x1e) +
                   ((uVar50 | uVar11) & uVar8 | uVar50 & uVar11);
          uVar51 = (uVar19 >> 0xe | uVar19 * 0x40000) ^ uVar19;
          uVar52 = (uVar47 >> 9 | uVar47 * 0x800000) ^ uVar47;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar19;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar47;
          iVar39 = uVar28 + ((uVar56 ^ uVar13) & uVar19 ^ uVar13) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            auVar97._8_4_ + puVar68[2];
          uVar11 = uVar11 + iVar39;
          uVar28 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar47 | uVar8) & uVar50 | uVar47 & uVar8);
          uVar51 = (uVar11 >> 0xe | uVar11 * 0x40000) ^ uVar11;
          uVar52 = (uVar28 >> 9 | uVar28 * 0x800000) ^ uVar28;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar11;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar28;
          iVar39 = uVar13 + ((uVar19 ^ uVar56) & uVar11 ^ uVar56) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            auVar97._12_4_ + puVar68[3];
          uVar8 = uVar8 + iVar39;
          uVar13 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar28 | uVar50) & uVar47 | uVar28 & uVar50);
          puVar1 = puVar68 + 4;
          puVar2 = puVar68 + 5;
          puVar3 = puVar68 + 6;
          puVar4 = puVar68 + 7;
          puVar68 = puVar68 + 8;
          uVar51 = (uVar8 >> 0xe | uVar8 * 0x40000) ^ uVar8;
          uVar52 = (uVar13 >> 9 | uVar13 * 0x800000) ^ uVar13;
          uVar51 = (uVar51 >> 5 | uVar51 << 0x1b) ^ uVar8;
          uVar52 = (uVar52 >> 0xb | uVar52 << 0x15) ^ uVar13;
          iVar39 = uVar56 + ((uVar11 ^ uVar19) & uVar8 ^ uVar19) + (uVar51 >> 6 | uVar51 << 0x1a) +
                            auVar99._0_4_ + *puVar1;
          uVar40 = uVar50 + iVar39;
          uVar57 = iVar39 + (uVar52 >> 2 | uVar52 << 0x1e) +
                   ((uVar13 | uVar47) & uVar28 | uVar13 & uVar47);
          uVar50 = (uVar40 >> 0xe | uVar40 * 0x40000) ^ uVar40;
          uVar51 = (uVar57 >> 9 | uVar57 * 0x800000) ^ uVar57;
          uVar50 = (uVar50 >> 5 | uVar50 << 0x1b) ^ uVar40;
          uVar51 = (uVar51 >> 0xb | uVar51 << 0x15) ^ uVar57;
          iVar39 = uVar19 + ((uVar8 ^ uVar11) & uVar40 ^ uVar11) + (uVar50 >> 6 | uVar50 << 0x1a) +
                            auVar99._4_4_ + *puVar2;
          uVar33 = uVar47 + iVar39;
          uVar19 = iVar39 + (uVar51 >> 2 | uVar51 << 0x1e) +
                   ((uVar57 | uVar28) & uVar13 | uVar57 & uVar28);
          uVar47 = (uVar33 >> 0xe | uVar33 * 0x40000) ^ uVar33;
          uVar50 = (uVar19 >> 9 | uVar19 * 0x800000) ^ uVar19;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar33;
          uVar50 = (uVar50 >> 0xb | uVar50 << 0x15) ^ uVar19;
          iVar39 = uVar11 + ((uVar40 ^ uVar8) & uVar33 ^ uVar8) + (uVar47 >> 6 | uVar47 << 0x1a) +
                            auVar99._8_4_ + *puVar3;
          uVar28 = uVar28 + iVar39;
          uVar11 = iVar39 + (uVar50 >> 2 | uVar50 << 0x1e) +
                   ((uVar19 | uVar13) & uVar57 | uVar19 & uVar13);
          uVar47 = (uVar28 >> 0xe | uVar28 * 0x40000) ^ uVar28;
          uVar50 = (uVar11 >> 9 | uVar11 * 0x800000) ^ uVar11;
          uVar47 = (uVar47 >> 5 | uVar47 << 0x1b) ^ uVar28;
          uVar50 = (uVar50 >> 0xb | uVar50 << 0x15) ^ uVar11;
          iVar39 = uVar8 + ((uVar33 ^ uVar40) & uVar28 ^ uVar40) + (uVar47 >> 6 | uVar47 << 0x1a) +
                           auVar99._12_4_ + *puVar4;
          uVar13 = uVar13 + iVar39;
          uVar8 = iVar39 + (uVar50 >> 2 | uVar50 << 0x1e) +
                  ((uVar11 | uVar57) & uVar19 | uVar11 & uVar57);
          lVar27 = lVar27 + -1;
          auVar97 = auVar101;
          auVar99 = auVar103;
        } while (lVar27 != 0);
        uVar8 = uVar8 + *s;
        *s = uVar8;
        uVar11 = uVar11 + s[1];
        s[1] = uVar11;
        uVar19 = uVar19 + s[2];
        s[2] = uVar19;
        uVar57 = uVar57 + s[3];
        s[3] = uVar57;
        uVar13 = uVar13 + s[4];
        s[4] = uVar13;
        uVar28 = uVar28 + s[5];
        s[5] = uVar28;
        uVar33 = uVar33 + s[6];
        s[6] = uVar33;
        uVar40 = uVar40 + s[7];
        s[7] = uVar40;
        chunk = (uint32_t *)((long)chunk + 0x40);
      } while ((undefined1 (*) [16])chunk != pauVar15);
    }
  }
  else if (blocks != 0) {
    uVar8 = *s;
    uVar11 = s[1];
    uVar19 = s[2];
    uVar57 = s[3];
    uVar13 = s[4];
    uVar28 = s[5];
    uVar47 = s[6];
    uVar33 = s[7];
    do {
      uVar50 = *chunk;
      uVar51 = chunk[1];
      uVar24 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8 | uVar50 << 0x18;
      iVar39 = ((uVar28 ^ uVar47) & uVar13 ^ uVar47) + uVar33 +
               ((uVar13 << 7 | uVar13 >> 0x19) ^
               (uVar13 << 0x15 | uVar13 >> 0xb) ^ (uVar13 << 0x1a | uVar13 >> 6));
      uVar9 = ((uVar8 | uVar11) & uVar19 | uVar8 & uVar11) +
              ((uVar8 << 10 | uVar8 >> 0x16) ^
              (uVar8 << 0x13 | uVar8 >> 0xd) ^ (uVar8 << 0x1e | uVar8 >> 2)) +
              uVar24 + iVar39 + 0x428a2f98;
      uVar74 = uVar57 + iVar39 + uVar24 + 0x428a2f98;
      uVar26 = uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8;
      uVar58 = uVar26 | uVar51 << 0x18;
      uVar50 = (uVar74 * 0x80 | uVar74 >> 0x19) ^
               (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6);
      iVar39 = ((uVar13 ^ uVar28) & uVar74 ^ uVar28) + uVar47 + uVar58;
      uVar72 = uVar19 + iVar39 + uVar50 + 0x71374491;
      uVar12 = ((uVar9 | uVar8) & uVar11 | uVar9 & uVar8) +
               ((uVar9 * 0x400 | uVar9 >> 0x16) ^
               (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) +
               iVar39 + uVar50 + 0x71374491;
      uVar52 = (uVar72 * 0x80 | uVar72 >> 0x19) ^
               (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6);
      uVar50 = chunk[2];
      uVar32 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8;
      uVar41 = uVar32 | uVar50 << 0x18;
      iVar39 = ((uVar74 ^ uVar13) & uVar72 ^ uVar13) + uVar41 + uVar28;
      uVar25 = ((uVar12 | uVar9) & uVar8 | uVar12 & uVar9) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) +
               iVar39 + uVar52 + -0x4a3f0431;
      uVar53 = iVar39 + uVar52 + uVar11 + 0xb5c0fbcf;
      uVar56 = (uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6);
      uVar52 = chunk[3];
      uVar43 = uVar52 >> 0x18 | (uVar52 & 0xff0000) >> 8 | (uVar52 & 0xff00) << 8;
      uVar48 = uVar43 | uVar52 << 0x18;
      iVar39 = ((uVar72 ^ uVar74) & uVar53 ^ uVar74) + uVar48 + uVar13;
      uVar29 = ((uVar25 | uVar12) & uVar9 | uVar25 & uVar12) +
               ((uVar25 * 0x400 | uVar25 >> 0x16) ^
               (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) +
               iVar39 + uVar56 + -0x164a245b;
      uVar73 = uVar8 + iVar39 + uVar56 + 0xe9b5dba5;
      uVar56 = chunk[4];
      uVar44 = uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8;
      uVar20 = uVar44 | uVar56 << 0x18;
      iVar39 = uVar74 + uVar20 + ((uVar53 ^ uVar72) & uVar73 ^ uVar72) +
               ((uVar73 * 0x80 | uVar73 >> 0x19) ^
               (uVar73 * 0x200000 | uVar73 >> 0xb) ^ (uVar73 * 0x4000000 | uVar73 >> 6)) +
               0x3956c25b;
      uVar9 = uVar9 + iVar39;
      uVar42 = ((uVar29 | uVar25) & uVar12 | uVar29 & uVar25) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar39;
      uVar74 = chunk[5];
      uVar45 = uVar74 >> 0x18 | (uVar74 & 0xff0000) >> 8 | (uVar74 & 0xff00) << 8;
      uVar21 = uVar45 | uVar74 << 0x18;
      iVar39 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
               (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
               uVar72 + uVar21 + ((uVar73 ^ uVar53) & uVar9 ^ uVar53) + 0x59f111f1;
      uVar12 = uVar12 + iVar39;
      uVar49 = ((uVar42 | uVar29) & uVar25 | uVar42 & uVar29) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar39;
      uVar72 = chunk[6];
      uVar46 = uVar72 >> 0x18 | (uVar72 & 0xff0000) >> 8 | (uVar72 & 0xff00) << 8;
      uVar22 = uVar46 | uVar72 << 0x18;
      iVar39 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar53 + uVar22 + ((uVar9 ^ uVar73) & uVar12 ^ uVar73) + -0x6dc07d5c;
      uVar25 = uVar25 + iVar39;
      uVar54 = ((uVar49 | uVar42) & uVar29 | uVar49 & uVar42) +
               ((uVar49 * 0x400 | uVar49 >> 0x16) ^
               (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar39;
      uVar53 = chunk[7];
      uVar60 = uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8;
      uVar23 = uVar60 | uVar53 << 0x18;
      iVar39 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
               (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
               uVar73 + uVar23 + ((uVar12 ^ uVar9) & uVar25 ^ uVar9) + -0x54e3a12b;
      uVar29 = uVar29 + iVar39;
      uVar69 = ((uVar54 | uVar49) & uVar42 | uVar54 & uVar49) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar39;
      uVar73 = chunk[8];
      uVar61 = uVar73 >> 0x18 | (uVar73 & 0xff0000) >> 8 | (uVar73 & 0xff00) << 8;
      uVar16 = uVar61 | uVar73 << 0x18;
      iVar39 = uVar9 + uVar16 + ((uVar25 ^ uVar12) & uVar29 ^ uVar12) +
               ((uVar29 * 0x80 | uVar29 >> 0x19) ^
               (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
               -0x27f85568;
      uVar42 = uVar42 + iVar39;
      uVar14 = ((uVar69 | uVar54) & uVar49 | uVar69 & uVar54) +
               ((uVar69 * 0x400 | uVar69 >> 0x16) ^
               (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar39;
      uVar9 = chunk[9];
      uVar62 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8;
      uVar17 = uVar62 | uVar9 << 0x18;
      iVar39 = uVar12 + uVar17 + ((uVar29 ^ uVar25) & uVar42 ^ uVar25) +
               ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               0x12835b01;
      uVar49 = uVar49 + iVar39;
      uVar10 = ((uVar14 | uVar69) & uVar54 | uVar14 & uVar69) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar39;
      uVar12 = chunk[10];
      uVar63 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
      uVar18 = uVar63 | uVar12 << 0x18;
      iVar39 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
               (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
               uVar25 + uVar18 + ((uVar42 ^ uVar29) & uVar49 ^ uVar29) + 0x243185be;
      uVar54 = uVar54 + iVar39;
      uVar59 = ((uVar10 | uVar14) & uVar69 | uVar10 & uVar14) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar39;
      uVar25 = chunk[0xb];
      uVar64 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8;
      uVar34 = uVar64 | uVar25 << 0x18;
      iVar39 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar29 + uVar34 + ((uVar49 ^ uVar42) & uVar54 ^ uVar42) + 0x550c7dc3;
      uVar69 = uVar69 + iVar39;
      uVar35 = ((uVar59 | uVar10) & uVar14 | uVar59 & uVar10) +
               ((uVar59 * 0x400 | uVar59 >> 0x16) ^
               (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar39;
      uVar29 = chunk[0xc];
      uVar65 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
      uVar30 = uVar65 | uVar29 << 0x18;
      iVar39 = ((uVar69 * 0x80 | uVar69 >> 0x19) ^
               (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) +
               uVar42 + uVar30 + ((uVar54 ^ uVar49) & uVar69 ^ uVar49) + 0x72be5d74;
      uVar14 = uVar14 + iVar39;
      uVar36 = ((uVar35 | uVar59) & uVar10 | uVar35 & uVar59) +
               ((uVar35 * 0x400 | uVar35 >> 0x16) ^
               (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar39;
      uVar42 = chunk[0xd];
      uVar66 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
      uVar31 = uVar66 | uVar42 << 0x18;
      iVar39 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar49 + uVar31 + ((uVar69 ^ uVar54) & uVar14 ^ uVar54) + -0x7f214e02;
      uVar10 = uVar10 + iVar39;
      uVar37 = ((uVar36 | uVar35) & uVar59 | uVar36 & uVar35) +
               ((uVar36 * 0x400 | uVar36 >> 0x16) ^
               (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar39;
      uVar49 = chunk[0xe];
      uVar70 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8;
      uVar67 = uVar70 | uVar49 << 0x18;
      iVar39 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar54 + uVar67 + ((uVar14 ^ uVar69) & uVar10 ^ uVar69) + -0x6423f959;
      uVar59 = uVar59 + iVar39;
      uVar38 = ((uVar37 | uVar36) & uVar35 | uVar37 & uVar36) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar39;
      uVar54 = chunk[0xf];
      uVar71 = uVar54 >> 0x18 | (uVar54 & 0xff0000) >> 8 | (uVar54 & 0xff00) << 8;
      uVar55 = uVar71 | uVar54 << 0x18;
      iVar39 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
               (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
               uVar69 + uVar55 + ((uVar10 ^ uVar14) & uVar59 ^ uVar14) + -0x3e640e8c;
      uVar35 = uVar35 + iVar39;
      uVar69 = ((uVar38 | uVar37) & uVar36 | uVar38 & uVar37) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar39;
      uVar24 = uVar24 + uVar17 +
               (uVar58 >> 3 ^
               (uVar26 << 0xe | uVar58 >> 0x12) ^ ((uVar51 >> 0x18) << 0x19 | uVar58 >> 7)) +
               (uVar67 >> 10 ^ (uVar70 << 0xd | uVar67 >> 0x13) ^ (uVar70 << 0xf | uVar67 >> 0x11));
      iVar39 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
               (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
               uVar14 + uVar24 + ((uVar59 ^ uVar10) & uVar35 ^ uVar10) + -0x1b64963f;
      uVar36 = uVar36 + iVar39;
      uVar14 = ((uVar69 | uVar38) & uVar37 | uVar69 & uVar38) +
               ((uVar69 * 0x400 | uVar69 >> 0x16) ^
               (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar39;
      uVar26 = uVar58 + uVar18 +
               (uVar41 >> 3 ^
               (uVar32 << 0xe | uVar41 >> 0x12) ^ ((uVar50 >> 0x18) << 0x19 | uVar41 >> 7)) +
               (uVar55 >> 10 ^ (uVar71 << 0xd | uVar55 >> 0x13) ^ (uVar71 << 0xf | uVar55 >> 0x11));
      iVar39 = ((uVar36 * 0x80 | uVar36 >> 0x19) ^
               (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) +
               uVar10 + uVar26 + ((uVar35 ^ uVar59) & uVar36 ^ uVar59) + -0x1041b87a;
      uVar37 = uVar37 + iVar39;
      uVar50 = ((uVar14 | uVar69) & uVar38 | uVar14 & uVar69) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar39;
      uVar32 = uVar41 + uVar34 +
               (uVar48 >> 3 ^
               (uVar43 << 0xe | uVar48 >> 0x12) ^ ((uVar52 >> 0x18) << 0x19 | uVar48 >> 7)) +
               (uVar24 >> 10 ^
               (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
      iVar39 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar59 + uVar32 + ((uVar36 ^ uVar35) & uVar37 ^ uVar35) + 0xfc19dc6;
      uVar38 = uVar38 + iVar39;
      uVar10 = ((uVar50 | uVar14) & uVar69 | uVar50 & uVar14) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar39;
      uVar43 = uVar48 + uVar30 +
               (uVar20 >> 3 ^
               (uVar44 << 0xe | uVar20 >> 0x12) ^ ((uVar56 >> 0x18) << 0x19 | uVar20 >> 7)) +
               (uVar26 >> 10 ^
               (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
      iVar39 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar35 + uVar43 + ((uVar37 ^ uVar36) & uVar38 ^ uVar36) + 0x240ca1cc;
      uVar69 = uVar69 + iVar39;
      uVar35 = ((uVar10 | uVar50) & uVar14 | uVar10 & uVar50) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar39;
      uVar20 = uVar20 + uVar31 +
               (uVar21 >> 3 ^
               (uVar45 << 0xe | uVar21 >> 0x12) ^ ((uVar74 >> 0x18) << 0x19 | uVar21 >> 7)) +
               (uVar32 >> 10 ^
               (uVar32 * 0x2000 | uVar32 >> 0x13) ^ (uVar32 * 0x8000 | uVar32 >> 0x11));
      iVar39 = ((uVar69 * 0x80 | uVar69 >> 0x19) ^
               (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) +
               uVar36 + uVar20 + ((uVar38 ^ uVar37) & uVar69 ^ uVar37) + 0x2de92c6f;
      uVar14 = uVar14 + iVar39;
      uVar51 = ((uVar35 | uVar10) & uVar50 | uVar35 & uVar10) +
               ((uVar35 * 0x400 | uVar35 >> 0x16) ^
               (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar39;
      uVar44 = uVar21 + uVar67 +
               (uVar22 >> 3 ^
               (uVar46 << 0xe | uVar22 >> 0x12) ^ ((uVar72 >> 0x18) << 0x19 | uVar22 >> 7)) +
               (uVar43 >> 10 ^
               (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
      iVar39 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar37 + uVar44 + ((uVar69 ^ uVar38) & uVar14 ^ uVar38) + 0x4a7484aa;
      uVar50 = uVar50 + iVar39;
      uVar74 = ((uVar51 | uVar35) & uVar10 | uVar51 & uVar35) +
               ((uVar51 * 0x400 | uVar51 >> 0x16) ^
               (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar39;
      uVar45 = uVar22 + uVar55 +
               (uVar23 >> 3 ^
               (uVar60 << 0xe | uVar23 >> 0x12) ^ ((uVar53 >> 0x18) << 0x19 | uVar23 >> 7)) +
               (uVar20 >> 10 ^
               (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
      iVar39 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
               (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
               uVar38 + uVar45 + ((uVar14 ^ uVar69) & uVar50 ^ uVar69) + 0x5cb0a9dc;
      uVar10 = uVar10 + iVar39;
      uVar36 = ((uVar74 | uVar51) & uVar35 | uVar74 & uVar51) +
               ((uVar74 * 0x400 | uVar74 >> 0x16) ^
               (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar39;
      uVar72 = (uVar16 >> 3 ^
               (uVar61 << 0xe | uVar16 >> 0x12) ^ ((uVar73 >> 0x18) << 0x19 | uVar16 >> 7)) + uVar23
               + uVar24 +
               (uVar44 >> 10 ^
               (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
      iVar39 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar69 + uVar72 + ((uVar50 ^ uVar14) & uVar10 ^ uVar14) + 0x76f988da;
      uVar35 = uVar35 + iVar39;
      uVar52 = ((uVar36 | uVar74) & uVar51 | uVar36 & uVar74) +
               ((uVar36 * 0x400 | uVar36 >> 0x16) ^
               (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar39;
      uVar73 = (uVar17 >> 3 ^
               (uVar62 << 0xe | uVar17 >> 0x12) ^ ((uVar9 >> 0x18) << 0x19 | uVar17 >> 7)) + uVar16
               + uVar26 +
               (uVar45 >> 10 ^
               (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
      iVar39 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
               (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
               uVar14 + uVar73 + ((uVar10 ^ uVar50) & uVar35 ^ uVar50) + -0x67c1aeae;
      uVar51 = uVar51 + iVar39;
      uVar53 = ((uVar52 | uVar36) & uVar74 | uVar52 & uVar36) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar39;
      uVar60 = (uVar18 >> 3 ^
               (uVar63 << 0xe | uVar18 >> 0x12) ^ ((uVar12 >> 0x18) << 0x19 | uVar18 >> 7)) + uVar17
               + uVar32 +
               (uVar72 >> 10 ^
               (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11));
      iVar39 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
               (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
               uVar50 + uVar60 + ((uVar35 ^ uVar10) & uVar51 ^ uVar10) + -0x57ce3993;
      uVar74 = uVar74 + iVar39;
      uVar46 = ((uVar53 | uVar52) & uVar36 | uVar53 & uVar52) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar39;
      uVar50 = (uVar34 >> 3 ^
               (uVar64 << 0xe | uVar34 >> 0x12) ^ ((uVar25 >> 0x18) << 0x19 | uVar34 >> 7)) + uVar18
               + uVar43 +
               (uVar73 >> 10 ^
               (uVar73 * 0x2000 | uVar73 >> 0x13) ^ (uVar73 * 0x8000 | uVar73 >> 0x11));
      iVar39 = ((uVar74 * 0x80 | uVar74 >> 0x19) ^
               (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) +
               uVar10 + uVar50 + ((uVar51 ^ uVar35) & uVar74 ^ uVar35) + -0x4ffcd838;
      uVar36 = uVar36 + iVar39;
      uVar56 = ((uVar46 | uVar53) & uVar52 | uVar46 & uVar53) +
               ((uVar46 * 0x400 | uVar46 >> 0x16) ^
               (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar39;
      uVar61 = (uVar30 >> 3 ^
               (uVar65 << 0xe | uVar30 >> 0x12) ^ ((uVar29 >> 0x18) << 0x19 | uVar30 >> 7)) + uVar34
               + uVar20 +
               (uVar60 >> 10 ^
               (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
      iVar39 = ((uVar36 * 0x80 | uVar36 >> 0x19) ^
               (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) +
               uVar35 + uVar61 + ((uVar74 ^ uVar51) & uVar36 ^ uVar51) + -0x40a68039;
      uVar52 = uVar52 + iVar39;
      uVar29 = ((uVar56 | uVar46) & uVar53 | uVar56 & uVar46) +
               ((uVar56 * 0x400 | uVar56 >> 0x16) ^
               (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar39;
      uVar64 = (uVar31 >> 3 ^
               (uVar66 << 0xe | uVar31 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar31 >> 7)) + uVar30
               + uVar44 +
               (uVar50 >> 10 ^
               (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
      iVar39 = uVar51 + uVar64 + ((uVar36 ^ uVar74) & uVar52 ^ uVar74) +
               ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               -0x391ff40d;
      uVar53 = uVar53 + iVar39;
      uVar42 = ((uVar29 | uVar56) & uVar46 | uVar29 & uVar56) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar39;
      uVar9 = (uVar67 >> 3 ^
              (uVar70 << 0xe | uVar67 >> 0x12) ^ ((uVar49 >> 0x18) << 0x19 | uVar67 >> 7)) + uVar31
              + uVar45 +
              (uVar61 >> 10 ^
              (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
      iVar39 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
               uVar74 + uVar9 + ((uVar52 ^ uVar36) & uVar53 ^ uVar36) + -0x2a586eb9;
      uVar46 = uVar46 + iVar39;
      uVar62 = ((uVar42 | uVar29) & uVar56 | uVar42 & uVar29) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar39;
      uVar65 = (uVar55 >> 3 ^
               (uVar71 << 0xe | uVar55 >> 0x12) ^ ((uVar54 >> 0x18) << 0x19 | uVar55 >> 7)) + uVar67
               + uVar72 +
               (uVar64 >> 10 ^
               (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
      iVar39 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
               (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
               uVar36 + uVar65 + ((uVar53 ^ uVar52) & uVar46 ^ uVar52) + 0x6ca6351;
      uVar56 = uVar56 + iVar39;
      uVar51 = ((uVar62 | uVar42) & uVar29 | uVar62 & uVar42) +
               ((uVar62 * 0x400 | uVar62 >> 0x16) ^
               (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar39;
      uVar12 = (uVar24 >> 3 ^
               (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) + uVar55 +
               uVar73 + (uVar9 >> 10 ^
                        (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      iVar39 = uVar52 + uVar12 + ((uVar46 ^ uVar53) & uVar56 ^ uVar53) +
               ((uVar56 * 0x80 | uVar56 >> 0x19) ^
               (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
               0x14292967;
      uVar29 = uVar29 + iVar39;
      uVar54 = ((uVar51 | uVar62) & uVar42 | uVar51 & uVar62) +
               ((uVar51 * 0x400 | uVar51 >> 0x16) ^
               (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar39;
      uVar70 = (uVar26 >> 3 ^
               (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) + uVar24 +
               uVar60 + (uVar65 >> 10 ^
                        (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
      iVar39 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
               (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
               uVar53 + uVar70 + ((uVar56 ^ uVar46) & uVar29 ^ uVar46) + 0x27b70a85;
      uVar42 = uVar42 + iVar39;
      uVar53 = ((uVar54 | uVar51) & uVar62 | uVar54 & uVar51) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar39;
      uVar25 = (uVar32 >> 3 ^
               (uVar32 * 0x4000 | uVar32 >> 0x12) ^ (uVar32 * 0x2000000 | uVar32 >> 7)) + uVar26 +
               uVar50 + (uVar12 >> 10 ^
                        (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
      iVar39 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               uVar46 + uVar25 + ((uVar29 ^ uVar56) & uVar42 ^ uVar56) + 0x2e1b2138;
      uVar62 = uVar62 + iVar39;
      uVar74 = ((uVar53 | uVar54) & uVar51 | uVar53 & uVar54) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar39;
      uVar71 = (uVar43 >> 3 ^
               (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)) + uVar32 +
               uVar61 + (uVar70 >> 10 ^
                        (uVar70 * 0x2000 | uVar70 >> 0x13) ^ (uVar70 * 0x8000 | uVar70 >> 0x11));
      iVar39 = ((uVar62 * 0x80 | uVar62 >> 0x19) ^
               (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6)) +
               uVar56 + uVar71 + ((uVar42 ^ uVar29) & uVar62 ^ uVar29) + 0x4d2c6dfc;
      uVar51 = uVar51 + iVar39;
      uVar49 = ((uVar74 | uVar53) & uVar54 | uVar74 & uVar53) +
               ((uVar74 * 0x400 | uVar74 >> 0x16) ^
               (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar39;
      uVar46 = (uVar20 >> 3 ^
               (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7)) + uVar43 +
               uVar64 + (uVar25 >> 10 ^
                        (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
      iVar39 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
               (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
               uVar29 + uVar46 + ((uVar62 ^ uVar42) & uVar51 ^ uVar42) + 0x53380d13;
      uVar54 = uVar54 + iVar39;
      uVar32 = ((uVar49 | uVar74) & uVar53 | uVar49 & uVar74) +
               ((uVar49 * 0x400 | uVar49 >> 0x16) ^
               (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar39;
      uVar29 = (uVar44 >> 3 ^
               (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) + uVar20 +
               uVar9 + (uVar71 >> 10 ^
                       (uVar71 * 0x2000 | uVar71 >> 0x13) ^ (uVar71 * 0x8000 | uVar71 >> 0x11));
      iVar39 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar42 + uVar29 + ((uVar51 ^ uVar62) & uVar54 ^ uVar62) + 0x650a7354;
      uVar53 = uVar53 + iVar39;
      uVar52 = ((uVar32 | uVar49) & uVar74 | uVar32 & uVar49) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar39;
      uVar42 = (uVar45 >> 3 ^
               (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) + uVar44 +
               uVar65 + (uVar46 >> 10 ^
                        (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
      iVar39 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
               uVar62 + uVar42 + ((uVar54 ^ uVar51) & uVar53 ^ uVar51) + 0x766a0abb;
      uVar74 = uVar74 + iVar39;
      uVar56 = ((uVar52 | uVar32) & uVar49 | uVar52 & uVar32) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar39;
      uVar62 = (uVar72 >> 3 ^
               (uVar72 * 0x4000 | uVar72 >> 0x12) ^ (uVar72 * 0x2000000 | uVar72 >> 7)) + uVar45 +
               uVar12 + (uVar29 >> 10 ^
                        (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
      iVar39 = ((uVar74 * 0x80 | uVar74 >> 0x19) ^
               (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) +
               uVar51 + uVar62 + ((uVar53 ^ uVar54) & uVar74 ^ uVar54) + -0x7e3d36d2;
      uVar49 = uVar49 + iVar39;
      uVar26 = ((uVar56 | uVar52) & uVar32 | uVar56 & uVar52) +
               ((uVar56 * 0x400 | uVar56 >> 0x16) ^
               (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar39;
      uVar10 = (uVar73 >> 3 ^
               (uVar73 * 0x4000 | uVar73 >> 0x12) ^ (uVar73 * 0x2000000 | uVar73 >> 7)) + uVar72 +
               uVar70 + (uVar42 >> 10 ^
                        (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
      iVar39 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
               (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
               uVar54 + uVar10 + ((uVar74 ^ uVar53) & uVar49 ^ uVar53) + -0x6d8dd37b;
      uVar32 = uVar32 + iVar39;
      uVar54 = ((uVar26 | uVar56) & uVar52 | uVar26 & uVar56) +
               ((uVar26 * 0x400 | uVar26 >> 0x16) ^
               (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar39;
      uVar63 = (uVar60 >> 3 ^
               (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) + uVar73 +
               uVar25 + (uVar62 >> 10 ^
                        (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
      iVar39 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar53 + uVar63 + ((uVar49 ^ uVar74) & uVar32 ^ uVar74) + -0x5d40175f;
      uVar52 = uVar52 + iVar39;
      uVar53 = ((uVar54 | uVar26) & uVar56 | uVar54 & uVar26) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar39;
      uVar72 = (uVar50 >> 3 ^
               (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) + uVar60 +
               uVar71 + (uVar10 >> 10 ^
                        (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
      iVar39 = uVar74 + uVar72 + ((uVar32 ^ uVar49) & uVar52 ^ uVar49) +
               ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               -0x57e599b5;
      uVar56 = uVar56 + iVar39;
      uVar73 = ((uVar53 | uVar54) & uVar26 | uVar53 & uVar54) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar39;
      uVar66 = (uVar61 >> 3 ^
               (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)) + uVar50 +
               uVar46 + (uVar63 >> 10 ^
                        (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
      iVar39 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
               (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
               uVar49 + uVar66 + ((uVar52 ^ uVar32) & uVar56 ^ uVar32) + -0x3db47490;
      uVar26 = uVar26 + iVar39;
      uVar14 = ((uVar73 | uVar53) & uVar54 | uVar73 & uVar53) +
               ((uVar73 * 0x400 | uVar73 >> 0x16) ^
               (uVar73 * 0x80000 | uVar73 >> 0xd) ^ (uVar73 * 0x40000000 | uVar73 >> 2)) + iVar39;
      uVar74 = (uVar64 >> 3 ^
               (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar61 +
               uVar29 + (uVar72 >> 10 ^
                        (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11));
      iVar39 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
               (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
               uVar32 + uVar74 + ((uVar56 ^ uVar52) & uVar26 ^ uVar52) + -0x3893ae5d;
      uVar54 = uVar54 + iVar39;
      uVar45 = ((uVar14 | uVar73) & uVar53 | uVar14 & uVar73) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar39;
      uVar51 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
               uVar64 + uVar42 +
               (uVar66 >> 10 ^
               (uVar66 * 0x2000 | uVar66 >> 0x13) ^ (uVar66 * 0x8000 | uVar66 >> 0x11));
      iVar39 = uVar52 + uVar51 + ((uVar26 ^ uVar56) & uVar54 ^ uVar56) +
               ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               -0x2e6d17e7;
      uVar53 = uVar53 + iVar39;
      uVar50 = ((uVar45 | uVar14) & uVar73 | uVar45 & uVar14) +
               ((uVar45 * 0x400 | uVar45 >> 0x16) ^
               (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar39;
      uVar43 = (uVar65 >> 3 ^
               (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7)) + uVar9 +
               uVar62 + (uVar74 >> 10 ^
                        (uVar74 * 0x2000 | uVar74 >> 0x13) ^ (uVar74 * 0x8000 | uVar74 >> 0x11));
      iVar39 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
               uVar56 + uVar43 + ((uVar54 ^ uVar26) & uVar53 ^ uVar26) + -0x2966f9dc;
      uVar73 = uVar73 + iVar39;
      uVar61 = ((uVar50 | uVar45) & uVar14 | uVar50 & uVar45) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar39;
      uVar49 = (uVar12 >> 3 ^
               (uVar12 * 0x4000 | uVar12 >> 0x12) ^ (uVar12 * 0x2000000 | uVar12 >> 7)) + uVar65 +
               uVar10 + (uVar51 >> 10 ^
                        (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
      iVar39 = uVar26 + uVar49 + ((uVar53 ^ uVar54) & uVar73 ^ uVar54) +
               ((uVar73 * 0x80 | uVar73 >> 0x19) ^
               (uVar73 * 0x200000 | uVar73 >> 0xb) ^ (uVar73 * 0x4000000 | uVar73 >> 6)) +
               -0xbf1ca7b;
      uVar14 = uVar14 + iVar39;
      uVar44 = ((uVar61 | uVar50) & uVar45 | uVar61 & uVar50) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar39;
      uVar56 = (uVar70 >> 3 ^
               (uVar70 * 0x4000 | uVar70 >> 0x12) ^ (uVar70 * 0x2000000 | uVar70 >> 7)) + uVar12 +
               uVar63 + (uVar43 >> 10 ^
                        (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
      iVar39 = uVar54 + uVar56 + ((uVar73 ^ uVar53) & uVar14 ^ uVar53) +
               ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               0x106aa070;
      uVar45 = uVar45 + iVar39;
      uVar26 = ((uVar44 | uVar61) & uVar50 | uVar44 & uVar61) +
               ((uVar44 * 0x400 | uVar44 >> 0x16) ^
               (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar39;
      uVar54 = (uVar25 >> 3 ^
               (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) + uVar70 +
               uVar72 + (uVar49 >> 10 ^
                        (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
      iVar39 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
               (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
               uVar53 + uVar54 + ((uVar14 ^ uVar73) & uVar45 ^ uVar73) + 0x19a4c116;
      uVar50 = uVar50 + iVar39;
      uVar32 = ((uVar26 | uVar44) & uVar61 | uVar26 & uVar44) +
               ((uVar26 * 0x400 | uVar26 >> 0x16) ^
               (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar39;
      uVar53 = (uVar71 >> 3 ^
               (uVar71 * 0x4000 | uVar71 >> 0x12) ^ (uVar71 * 0x2000000 | uVar71 >> 7)) + uVar25 +
               uVar66 + (uVar56 >> 10 ^
                        (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar39 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
               (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
               uVar73 + uVar53 + ((uVar45 ^ uVar14) & uVar50 ^ uVar14) + 0x1e376c08;
      uVar61 = uVar61 + iVar39;
      uVar60 = ((uVar32 | uVar26) & uVar44 | uVar32 & uVar26) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar39;
      uVar25 = (uVar46 >> 3 ^
               (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) + uVar71 +
               uVar74 + (uVar54 >> 10 ^
                        (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
      iVar39 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
               (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
               uVar14 + uVar25 + ((uVar50 ^ uVar45) & uVar61 ^ uVar45) + 0x2748774c;
      uVar44 = uVar44 + iVar39;
      uVar64 = ((uVar60 | uVar32) & uVar26 | uVar60 & uVar32) +
               ((uVar60 * 0x400 | uVar60 >> 0x16) ^
               (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar39;
      uVar73 = (uVar29 >> 3 ^
               (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7)) + uVar46 +
               uVar51 + (uVar53 >> 10 ^
                        (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
      iVar39 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
               (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
               uVar45 + uVar73 + ((uVar61 ^ uVar50) & uVar44 ^ uVar50) + 0x34b0bcb5;
      uVar26 = uVar26 + iVar39;
      uVar52 = ((uVar64 | uVar60) & uVar32 | uVar64 & uVar60) +
               ((uVar64 * 0x400 | uVar64 >> 0x16) ^
               (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar39;
      uVar29 = (uVar42 >> 3 ^
               (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) + uVar29 +
               uVar43 + (uVar25 >> 10 ^
                        (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
      iVar39 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
               (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
               uVar50 + uVar29 + ((uVar44 ^ uVar61) & uVar26 ^ uVar61) + 0x391c0cb3;
      uVar32 = uVar32 + iVar39;
      uVar45 = ((uVar52 | uVar64) & uVar60 | uVar52 & uVar64) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar39;
      uVar9 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)
              ) + uVar42 + uVar49 +
              (uVar73 >> 10 ^
              (uVar73 * 0x2000 | uVar73 >> 0x13) ^ (uVar73 * 0x8000 | uVar73 >> 0x11));
      iVar39 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar61 + uVar9 + ((uVar26 ^ uVar44) & uVar32 ^ uVar44) + 0x4ed8aa4a;
      uVar60 = uVar60 + iVar39;
      uVar50 = ((uVar45 | uVar52) & uVar64 | uVar45 & uVar52) +
               ((uVar45 * 0x400 | uVar45 >> 0x16) ^
               (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar39;
      uVar46 = (uVar10 >> 3 ^
               (uVar10 * 0x4000 | uVar10 >> 0x12) ^ (uVar10 * 0x2000000 | uVar10 >> 7)) + uVar62 +
               uVar56 + (uVar29 >> 10 ^
                        (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
      iVar39 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
               (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
               uVar44 + uVar46 + ((uVar32 ^ uVar26) & uVar60 ^ uVar26) + 0x5b9cca4f;
      uVar64 = uVar64 + iVar39;
      uVar44 = ((uVar50 | uVar45) & uVar52 | uVar50 & uVar45) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar39;
      uVar12 = (uVar63 >> 3 ^
               (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) + uVar10 +
               uVar54 + (uVar9 >> 10 ^
                        (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      iVar39 = ((uVar64 * 0x80 | uVar64 >> 0x19) ^
               (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6)) +
               uVar26 + uVar12 + ((uVar60 ^ uVar32) & uVar64 ^ uVar32) + 0x682e6ff3;
      uVar52 = uVar52 + iVar39;
      uVar42 = ((uVar44 | uVar50) & uVar45 | uVar44 & uVar50) +
               ((uVar44 * 0x400 | uVar44 >> 0x16) ^
               (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar39;
      uVar26 = (uVar72 >> 3 ^
               (uVar72 * 0x4000 | uVar72 >> 0x12) ^ (uVar72 * 0x2000000 | uVar72 >> 7)) + uVar63 +
               uVar53 + (uVar46 >> 10 ^
                        (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
      iVar39 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               uVar32 + uVar26 + ((uVar64 ^ uVar60) & uVar52 ^ uVar60) + 0x748f82ee;
      uVar45 = uVar45 + iVar39;
      uVar53 = ((uVar42 | uVar44) & uVar50 | uVar42 & uVar44) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar39;
      uVar72 = (uVar66 >> 3 ^
               (uVar66 * 0x4000 | uVar66 >> 0x12) ^ (uVar66 * 0x2000000 | uVar66 >> 7)) + uVar72 +
               uVar25 + (uVar12 >> 10 ^
                        (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
      iVar39 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
               (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
               uVar60 + uVar72 + ((uVar52 ^ uVar64) & uVar45 ^ uVar64) + 0x78a5636f;
      uVar50 = uVar50 + iVar39;
      uVar25 = ((uVar53 | uVar42) & uVar44 | uVar53 & uVar42) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar39;
      uVar73 = (uVar74 >> 3 ^
               (uVar74 * 0x4000 | uVar74 >> 0x12) ^ (uVar74 * 0x2000000 | uVar74 >> 7)) + uVar66 +
               uVar73 + (uVar26 >> 10 ^
                        (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
      iVar39 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
               (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
               uVar64 + uVar73 + ((uVar45 ^ uVar52) & uVar50 ^ uVar52) + -0x7b3787ec;
      uVar44 = uVar44 + iVar39;
      uVar32 = ((uVar25 | uVar53) & uVar42 | uVar25 & uVar53) +
               ((uVar25 * 0x400 | uVar25 >> 0x16) ^
               (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar39;
      uVar74 = (uVar51 >> 3 ^
               (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7)) + uVar74 +
               uVar29 + (uVar72 >> 10 ^
                        (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11));
      iVar39 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
               (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
               uVar52 + uVar74 + ((uVar50 ^ uVar45) & uVar44 ^ uVar45) + -0x7338fdf8;
      uVar42 = uVar42 + iVar39;
      uVar52 = ((uVar32 | uVar25) & uVar53 | uVar32 & uVar25) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar39;
      uVar73 = (uVar43 >> 3 ^
               (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)) + uVar51 +
               uVar9 + (uVar73 >> 10 ^
                       (uVar73 * 0x2000 | uVar73 >> 0x13) ^ (uVar73 * 0x8000 | uVar73 >> 0x11));
      iVar39 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               uVar45 + uVar73 + ((uVar44 ^ uVar50) & uVar42 ^ uVar50) + -0x6f410006;
      uVar53 = uVar53 + iVar39;
      uVar72 = ((uVar52 | uVar32) & uVar25 | uVar52 & uVar32) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar39;
      uVar51 = (uVar49 >> 3 ^
               (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7)) + uVar43 +
               uVar46 + (uVar74 >> 10 ^
                        (uVar74 * 0x2000 | uVar74 >> 0x13) ^ (uVar74 * 0x8000 | uVar74 >> 0x11));
      iVar39 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
               uVar50 + uVar51 + ((uVar42 ^ uVar44) & uVar53 ^ uVar44) + -0x5baf9315;
      uVar25 = uVar25 + iVar39;
      uVar74 = ((uVar72 | uVar52) & uVar32 | uVar72 & uVar52) +
               ((uVar72 * 0x400 | uVar72 >> 0x16) ^
               (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar39;
      iVar39 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar49 +
               uVar12 + (uVar73 >> 10 ^
                        (uVar73 * 0x2000 | uVar73 >> 0x13) ^ (uVar73 * 0x8000 | uVar73 >> 0x11)) +
               uVar44 + ((uVar53 ^ uVar42) & uVar25 ^ uVar42) +
               ((uVar25 * 0x80 | uVar25 >> 0x19) ^
               (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
               -0x41065c09;
      uVar32 = uVar32 + iVar39;
      uVar50 = ((uVar74 | uVar72) & uVar52 | uVar74 & uVar72) +
               ((uVar74 * 0x400 | uVar74 >> 0x16) ^
               (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar39;
      iVar39 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               (uVar54 >> 3 ^
               (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7)) + uVar56 +
               uVar26 + (uVar51 >> 10 ^
                        (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11)) +
               uVar42 + ((uVar25 ^ uVar53) & uVar32 ^ uVar53) + -0x398e870e;
      uVar11 = uVar50 + uVar11;
      uVar19 = uVar74 + uVar19;
      uVar57 = uVar72 + uVar57;
      uVar8 = ((uVar50 | uVar74) & uVar72 | uVar50 & uVar74) + uVar8 +
              ((uVar50 * 0x400 | uVar50 >> 0x16) ^
              (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar39;
      uVar13 = uVar52 + uVar13 + iVar39;
      uVar28 = uVar32 + uVar28;
      uVar47 = uVar25 + uVar47;
      uVar33 = uVar33 + uVar53;
      chunk = chunk + 0x10;
      *s = uVar8;
      s[1] = uVar11;
      s[2] = uVar19;
      s[3] = uVar57;
      s[4] = uVar13;
      s[5] = uVar28;
      s[6] = uVar47;
      s[7] = uVar33;
      blocks = blocks - 1;
    } while (blocks != 0);
  }
  return;
}

Assistant:

static inline void Transform(uint32_t *s, const uint32_t *chunk, size_t blocks)
{
#if defined(__x86_64__) || defined(__amd64__)
	if (use_optimized_transform) {
		TransformSSE4(s, chunk, blocks);
		return;
	}
#endif
	TransformDefault(s, chunk, blocks);
}